

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

void __thiscall tk::_data::_data(_data *this,char *dt,uint32_t sz,bool o)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if (dt != (char *)0x0) {
    uVar1 = sz;
  }
  this->size = uVar1;
  this->owned = dt != (char *)0x0 && o;
  this->data = dt;
  return;
}

Assistant:

_data::_data(char *dt, uint32_t sz, bool o) {
        if(!dt){
            this->size = 0;
            this->owned = false;
            this->data = 0;
        }else{
            this->size = sz;
            this->owned = o;
            this->data = dt;
        }
    }